

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_uncheckedDownCastValue
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t result,sysbvm_tuple_t type,sysbvm_tuple_t value)

{
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *psVar1;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instructionObject;
  sysbvm_tuple_t sVar2;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar3;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s **ppsVar4;
  
  sVar2 = sysbvm_array_create(context,3);
  if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
    *(sysbvm_tuple_t *)(sVar2 + 0x10) = result;
    *(sysbvm_tuple_t *)(sVar2 + 0x18) = type;
    *(sysbvm_tuple_t *)(sVar2 + 0x20) = value;
  }
  psVar3 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)
           sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionBytecodeAssemblerInstruction,9);
  psVar3[1].super.header.field_0.typePointer = 0x333;
  psVar3[1].super.header.identityHashAndFlags = (int)sVar2;
  psVar3[1].super.header.objectSize = (int)(sVar2 >> 0x20);
  psVar1 = assembler->lastInstruction;
  psVar3->previous = psVar1;
  ppsVar4 = &psVar1->next;
  if (psVar1 == (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    ppsVar4 = &assembler->firstInstruction;
  }
  *ppsVar4 = psVar3;
  assembler->lastInstruction = psVar3;
  psVar3->sourceASTNode = assembler->sourceASTNode;
  psVar3->sourceEnvironment = assembler->sourceEnvironment;
  psVar3->sourcePosition = assembler->sourcePosition;
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_uncheckedDownCastValue(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t result, sysbvm_tuple_t type, sysbvm_tuple_t value)
{
    sysbvm_tuple_t operands = sysbvm_array_create(context, 3);
    sysbvm_array_atPut(operands, 0, result);
    sysbvm_array_atPut(operands, 1, type);
    sysbvm_array_atPut(operands, 2, value);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_UNCHECKED_DOWNCAST_VALUE, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}